

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O1

pair<bool,_ccs::Value> * __thiscall
anon_unknown.dwarf_8dc6c::P::parseAndReturnValue
          (pair<bool,_ccs::Value> *__return_storage_ptr__,P *this,string *input)

{
  AstRule *pAVar1;
  bool bVar2;
  long lVar3;
  Nested ast;
  istringstream str;
  bool local_249;
  undefined1 local_248 [32];
  anon_union_8_3_b5ef88d7_for_rawPrimVal_ aStack_228;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  Nested local_1e0;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)input,_S_in);
  local_1e0.super_AstRule._vptr_AstRule = (_func_int **)&PTR__Nested_001aa430;
  local_1e0.selector_.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_1e0.selector_.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1e0.rules_.
  super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.rules_.
  super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.rules_.
  super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"<literal>","");
  bVar2 = ::ccs::Parser::parseCcsStream
                    (&this->parser,(string *)local_248,(istream *)local_1b0,&local_1e0);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((bVar2) &&
     ((long)local_1e0.rules_.
            super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1e0.rules_.
            super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8)) {
    pAVar1 = ((local_1e0.rules_.
               super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>._M_t.
             super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
             super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl;
    if (pAVar1 == (AstRule *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = __dynamic_cast(pAVar1,&::ccs::ast::AstRule::typeinfo,&::ccs::ast::PropDef::typeinfo,0)
      ;
    }
    if (lVar3 != 0) {
      local_248[0] = 1;
      std::pair<bool,_ccs::Value>::pair<bool,_ccs::Value_&,_true>
                (__return_storage_ptr__,(bool *)local_248,(Value *)(lVar3 + 0x28));
      goto LAB_0012f39c;
    }
  }
  local_249 = false;
  local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = 0;
  local_248._24_8_ = 0;
  aStack_228.intVal = 0;
  local_218 = 0;
  local_210._M_local_buf[0] = '\0';
  local_1f8 = 0;
  local_1f0._M_local_buf[0] = '\0';
  local_220._M_p = (pointer)&local_210;
  local_200._M_p = (pointer)&local_1f0;
  std::pair<bool,_ccs::Value>::pair<bool,_ccs::Value,_true>
            (__return_storage_ptr__,&local_249,(Value *)local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_p != &local_1f0) {
    operator_delete(local_200._M_p,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_p != &local_210) {
    operator_delete(local_220._M_p,
                    CONCAT71(local_210._M_allocated_capacity._1_7_,local_210._M_local_buf[0]) + 1);
  }
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::~vector
            ((vector<ccs::StringElem,_std::allocator<ccs::StringElem>_> *)(local_248 + 8));
LAB_0012f39c:
  local_1e0.super_AstRule._vptr_AstRule = (_func_int **)&PTR__Nested_001aa430;
  std::
  vector<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
  ::~vector(&local_1e0.rules_);
  if (local_1e0.selector_.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.selector_.
               super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, Value> parseAndReturnValue(const std::string &input) {
    std::istringstream str(input);
    ast::Nested ast;
    if (!parser.parseCcsStream("<literal>", str, ast)) return {false, Value()};
    if (ast.rules_.size() != 1) return {false, Value()};
    ast::PropDef *propDef = dynamic_cast<ast::PropDef*>(ast.rules_[0].get());
    if (!propDef) return {false, Value()};
    return {true, propDef->value_};
  }